

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O1

string * ChecksumNameShort_abi_cxx11_
                   (string *__return_storage_ptr__,
                   set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *methods)

{
  bool bVar1;
  _Base_ptr p_Var2;
  long lVar3;
  char *pcVar4;
  _Rb_tree_header *p_Var5;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  p_Var2 = (methods->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(methods->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var5) {
    bVar1 = true;
    do {
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"|",1);
      }
      lVar3 = 4;
      switch(p_Var2[1]._M_color) {
      case _S_red:
        pcVar4 = "none";
        break;
      case _S_black:
        pcVar4 = "8C15";
        break;
      case 2:
        lVar3 = 3;
        pcVar4 = "sum";
        break;
      case 3:
        lVar3 = 3;
        pcVar4 = "xor";
        break;
      case 4:
        lVar3 = 5;
        pcVar4 = "xorA0";
        break;
      case 5:
        pcVar4 = "crc0";
        break;
      case 6:
        pcVar4 = "crc2";
        break;
      default:
        goto switchD_0015865e_default;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar4,lVar3);
switchD_0015865e_default:
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ChecksumNameShort(std::set<ChecksumType> methods)
{
    std::stringstream ss;
    bool first = true;

    for (auto& m : methods)
    {
        if (!first)
            ss << "|";
        first = false;

        switch (m)
        {
        case ChecksumType::None:            ss << "none"; break;
        case ChecksumType::Constant_8C15:   ss << "8C15"; break;
        case ChecksumType::Sum_1800:        ss << "sum"; break;
        case ChecksumType::XOR_1800:        ss << "xor"; break;
        case ChecksumType::XOR_18A0:        ss << "xorA0"; break;
        case ChecksumType::CRC_D2F6_1800:   ss << "crc0"; break;
        case ChecksumType::CRC_D2F6_1802:   ss << "crc2"; break;
        }
    }

    return ss.str();
}